

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O0

void __thiscall
DIS::ElectromagneticEmissionSystemData::marshal
          (ElectromagneticEmissionSystemData *this,DataStream *dataStream)

{
  pointer pTVar1;
  size_type sVar2;
  pointer pTVar3;
  const_reference pvVar4;
  undefined1 local_a0 [8];
  ElectromagneticEmissionBeamData x;
  size_t idx;
  DataStream *dataStream_local;
  ElectromagneticEmissionSystemData *this_local;
  
  DataStream::operator<<(dataStream,this->_systemDataLength);
  sVar2 = std::
          vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
          ::size(&this->_beamDataRecords);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  DataStream::operator<<(dataStream,this->_emissionsPadding2);
  EmitterSystem::marshal(&this->_emitterSystem,dataStream);
  Vector3Float::marshal(&this->_location,dataStream);
  x._trackJamTargets.super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pTVar1 = x._trackJamTargets.
             super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pTVar3 = (pointer)std::
                      vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                      ::size(&this->_beamDataRecords);
    if (pTVar3 <= pTVar1) break;
    pvVar4 = std::
             vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
             ::operator[](&this->_beamDataRecords,
                          (size_type)
                          x._trackJamTargets.
                          super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData
              ((ElectromagneticEmissionBeamData *)local_a0,pvVar4);
    ElectromagneticEmissionBeamData::marshal((ElectromagneticEmissionBeamData *)local_a0,dataStream)
    ;
    ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData
              ((ElectromagneticEmissionBeamData *)local_a0);
    x._trackJamTargets.super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(x._trackJamTargets.
                           super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_TrackJamData +
                  1);
  }
  return;
}

Assistant:

void ElectromagneticEmissionSystemData::marshal(DataStream& dataStream) const
{
    dataStream << _systemDataLength;
    dataStream << ( unsigned char )_beamDataRecords.size();
    dataStream << _emissionsPadding2;
    _emitterSystem.marshal(dataStream);
    _location.marshal(dataStream);

    for(size_t idx = 0; idx < _beamDataRecords.size(); idx++)
    {
        ElectromagneticEmissionBeamData x = _beamDataRecords[idx];
        x.marshal(dataStream);
    }
}